

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O2

bool __thiscall wallet::CWalletTx::IsEquivalentTo(CWalletTx *this,CWalletTx *_tx)

{
  bool bVar1;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  CTxIn *txin;
  pointer pCVar2;
  long in_FS_OFFSET;
  CMutableTransaction tx2;
  CMutableTransaction tx1;
  CMutableTransaction local_198;
  CMutableTransaction local_160;
  CTransaction local_128;
  undefined1 local_a8 [57];
  transaction_identifier<false> local_6f [2];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction
            (&local_160,
             (this->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  CMutableTransaction::CMutableTransaction
            (&local_198,
             (_tx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  for (pCVar2 = local_160.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start;
      pCVar2 != local_160.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish; pCVar2 = pCVar2 + 1) {
    local_a8._16_8_ = 0;
    local_a8._24_8_ = (pointer)0x0;
    local_a8._0_8_ = (char *)0x0;
    local_a8._8_8_ = 0;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&(pCVar2->scriptSig).super_CScriptBase,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8);
  }
  for (pCVar2 = local_198.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start;
      pCVar2 != local_198.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish; pCVar2 = pCVar2 + 1) {
    local_a8._16_8_ = 0;
    local_a8._24_8_ = (pointer)0x0;
    local_a8._0_8_ = (char *)0x0;
    local_a8._8_8_ = 0;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&(pCVar2->scriptSig).super_CScriptBase,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8);
  }
  CTransaction::CTransaction((CTransaction *)local_a8,&local_160);
  CTransaction::CTransaction(&local_128,&local_198);
  bVar1 = transaction_identifier<false>::operator==(local_6f,&local_128.hash);
  CTransaction::~CTransaction(&local_128);
  CTransaction::~CTransaction((CTransaction *)local_a8);
  CMutableTransaction::~CMutableTransaction(&local_198);
  CMutableTransaction::~CMutableTransaction(&local_160);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CWalletTx::IsEquivalentTo(const CWalletTx& _tx) const
{
        CMutableTransaction tx1 {*this->tx};
        CMutableTransaction tx2 {*_tx.tx};
        for (auto& txin : tx1.vin) txin.scriptSig = CScript();
        for (auto& txin : tx2.vin) txin.scriptSig = CScript();
        return CTransaction(tx1) == CTransaction(tx2);
}